

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

ostream * Kernel::operator<<(ostream *out,Inference *self)

{
  InferenceRule in_DL;
  InferenceRule extraout_DL;
  long lVar1;
  char *pcVar2;
  string local_38;
  
  switch((uint)*(undefined8 *)self & 3) {
  case 0:
    pcVar2 = "INFERENCE_012, (";
    lVar1 = 0x10;
    break;
  case 1:
    pcVar2 = "INFERENCE_MANY, (";
    lVar1 = 0x11;
    break;
  case 2:
    pcVar2 = "INFERENCE_FROM_SAT_REFUTATION, (";
    lVar1 = 0x20;
    break;
  case 3:
    goto switchD_00526fc8_caseD_3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  in_DL = extraout_DL;
switchD_00526fc8_caseD_3:
  ruleName_abi_cxx11_(&local_38,(Kernel *)(ulong)(byte)self->field_0x1,in_DL);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(byte)local_38._M_dataplus._M_p),
             local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(byte)local_38._M_dataplus._M_p) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_38._M_dataplus._M_p._1_7_,(byte)local_38._M_dataplus._M_p),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"), it: ",7);
  local_38._M_dataplus._M_p._0_1_ = *(byte *)self >> 2 & 7;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,", incl: ",8);
  std::ostream::_M_insert<bool>(SUB81(out,0));
  std::__ostream_insert<char,std::char_traits<char>>(out,", ptd: ",7);
  std::ostream::_M_insert<bool>(SUB81(out,0));
  if (*(char *)(Lib::env + 0xec92) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(out,", cad: ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  if (*(char *)(Lib::env + 0xed6a) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(out,", pad: ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  if ((*(char *)(Lib::env + 0xec92) == '\x01') && (*(char *)(Lib::env + 0xed6a) == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", had: ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", id: ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  if (0 < *(int *)(Lib::env + 0xf358)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,", xxNarrs ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  if (*(char *)(Lib::env + 0xf27a) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(out,", redLen ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)out);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", sl: ",6);
  local_38._M_dataplus._M_p._0_1_ = self->field_0x4;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,", age: ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(out,", thAx:",7);
  std::ostream::operator<<(out,(int)self->th_ancestors);
  std::__ostream_insert<char,std::char_traits<char>>(out,", allAx:",8);
  std::ostream::operator<<(out,(int)self->all_ancestors);
  return out;
}

Assistant:

std::ostream& Kernel::operator<<(std::ostream& out, Inference const& self)
{
  switch(self._kind) {
    case Inference::Kind::INFERENCE_012:
      out << "INFERENCE_012, (";
      break;
    case Inference::Kind::INFERENCE_MANY:
      out << "INFERENCE_MANY, (";
      break;
    case Inference::Kind::INFERENCE_FROM_SAT_REFUTATION:
      out << "INFERENCE_FROM_SAT_REFUTATION, (";
      break;
  }
  // TODO get rid of intermediate string generation by ruleName
  out << ruleName(self._rule);
  out << "), it: " << toNumber(self._inputType);

  out << ", incl: " << self._included;
  out << ", ptd: " << self._isPureTheoryDescendant;
  if(env.options->addCombAxioms()){
    out << ", cad: " << self._combAxiomsDescendant;
  }
  if(env.options->addProxyAxioms()){
     out << ", pad: " << self._proxyAxiomsDescendant;
  }
  if(env.options->addCombAxioms() && env.options->addProxyAxioms()){
    out << ", had: " << self._holAxiomsDescendant;
  }
  out << ", id: " << self._inductionDepth;
  if(env.options->maxXXNarrows() > 0){
    out << ", xxNarrs " << self._XXNarrows;
  }
  if(env.options->prioritiseClausesProducedByLongReduction()){
    out << ", redLen " << self._reductions;
  }
  out << ", sl: " << self._sineLevel;
  out << ", age: " << self._age;
  out << ", thAx:" << (int)(self.th_ancestors);
  out << ", allAx:" << (int)(self.all_ancestors);

  return out;
}